

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TextFlow::Column::const_iterator::const_iterator(const_iterator *this,Column *column)

{
  bool bVar1;
  string *in_RSI;
  const_iterator *in_RDI;
  const_iterator cVar2;
  const_iterator *in_stack_00000070;
  AnsiSkippingString *in_stack_ffffffffffffffe0;
  const_iterator local_18;
  
  in_RDI->m_string = in_RSI;
  cVar2 = AnsiSkippingString::begin((AnsiSkippingString *)0x196e99);
  *(const_iterator *)&in_RDI->m_it = cVar2;
  cVar2 = AnsiSkippingString::begin((AnsiSkippingString *)0x196eb2);
  *(const_iterator *)&in_RDI[1].m_it = cVar2;
  cVar2 = AnsiSkippingString::begin((AnsiSkippingString *)0x196ecb);
  *(const_iterator *)&in_RDI[2].m_it = cVar2;
  *(undefined1 *)&in_RDI[3].m_it._M_current = 0;
  calcLength(in_stack_00000070);
  bVar1 = AnsiSkippingString::const_iterator::operator==
                    ((const_iterator *)in_stack_ffffffffffffffe0,in_RDI);
  if (bVar1) {
    cVar2 = AnsiSkippingString::end(in_stack_ffffffffffffffe0);
    (in_RDI->m_it)._M_current = (char *)cVar2.m_string;
    local_18 = cVar2.m_it._M_current;
    in_RDI[1].m_string = (string *)local_18._M_current;
  }
  return;
}

Assistant:

Column::const_iterator::const_iterator( Column const& column ):
            m_column( column ),
            m_lineStart( column.m_string.begin() ),
            m_lineEnd( column.m_string.begin() ),
            m_parsedTo( column.m_string.begin() ) {
            assert( m_column.m_width > m_column.m_indent );
            assert( m_column.m_initialIndent == std::string::npos ||
                    m_column.m_width > m_column.m_initialIndent );
            calcLength();
            if ( m_lineStart == m_lineEnd ) {
                m_lineStart = m_column.m_string.end();
            }
        }